

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

Aig_Man_t * Dar_ManRwsat(Aig_Man_t *pAig,int fBalance,int fVerbose)

{
  long lVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Man_t *p;
  long lVar4;
  timespec ts;
  Dar_RwrPar_t ParsRwr;
  Dar_RefPar_t ParsRef;
  timespec local_88;
  Dar_RwrPar_t local_74;
  Dar_RefPar_t local_50;
  
  lVar1 = pAig->Time2Quit;
  Dar_ManDefaultRwrParams(&local_74);
  Dar_ManDefaultRefParams(&local_50);
  local_74.fUpdateLevel = 0;
  local_50.fUpdateLevel = 0;
  local_74.fVerbose = fVerbose;
  local_50.fVerbose = fVerbose;
  pAVar3 = Aig_ManDupDfs(pAig);
  if (fVerbose != 0) {
    printf("Starting:  ");
    Aig_ManPrintStats(pAVar3);
  }
  p = pAVar3;
  if (fBalance != 0) {
    pAVar3->Time2Quit = lVar1;
    p = Dar_ManBalance(pAVar3,0);
    Aig_ManStop(pAVar3);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(p);
    }
    if (lVar1 != 0) {
      iVar2 = clock_gettime(3,&local_88);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      if (lVar1 < lVar4) goto joined_r0x00490447;
    }
  }
  p->Time2Quit = lVar1;
  Dar_ManRewrite(p,&local_74);
  pAVar3 = Aig_ManDupDfs(p);
  Aig_ManStop(p);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar3);
  }
  if (lVar1 != 0) {
    iVar2 = clock_gettime(3,&local_88);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    p = pAVar3;
    if (lVar1 < lVar4) goto joined_r0x00490447;
  }
  pAVar3->Time2Quit = lVar1;
  Dar_ManRefactor(pAVar3,&local_50);
  p = Aig_ManDupDfs(pAVar3);
  Aig_ManStop(pAVar3);
  if (fVerbose != 0) {
    printf("Refactor:  ");
    Aig_ManPrintStats(p);
  }
  if (lVar1 != 0) {
    iVar2 = clock_gettime(3,&local_88);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    if (lVar1 < lVar4) goto joined_r0x00490447;
  }
  pAVar3 = p;
  if (fBalance != 0) {
    p->Time2Quit = lVar1;
    pAVar3 = Dar_ManBalance(p,0);
    Aig_ManStop(p);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(pAVar3);
    }
    if (lVar1 != 0) {
      iVar2 = clock_gettime(3,&local_88);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      p = pAVar3;
      if (lVar1 < lVar4) goto joined_r0x00490447;
    }
  }
  pAVar3->Time2Quit = lVar1;
  Dar_ManRewrite(pAVar3,&local_74);
  p = Aig_ManDupDfs(pAVar3);
  Aig_ManStop(pAVar3);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(p);
  }
  if (lVar1 == 0) {
    return p;
  }
  iVar2 = clock_gettime(3,&local_88);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  if (lVar4 <= lVar1) {
    return p;
  }
joined_r0x00490447:
  if (p != (Aig_Man_t *)0x0) {
    Aig_ManStop(p);
  }
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Dar_ManRwsat( Aig_Man_t * pAig, int fBalance, int fVerbose )
//alias rwsat       "st; rw -l; b -l; rw -l; rf -l"
{
    Aig_Man_t * pTemp;
    abctime Time = pAig->Time2Quit;

    Dar_RwrPar_t ParsRwr, * pParsRwr = &ParsRwr;
    Dar_RefPar_t ParsRef, * pParsRef = &ParsRef;

    Dar_ManDefaultRwrParams( pParsRwr );
    Dar_ManDefaultRefParams( pParsRef );

    pParsRwr->fUpdateLevel = 0;
    pParsRef->fUpdateLevel = 0;

    pParsRwr->fVerbose = fVerbose;
    pParsRef->fVerbose = fVerbose;
//printf( "1" );
    pAig = Aig_ManDupDfs( pAig ); 
    if ( fVerbose ) printf( "Starting:  " ), Aig_ManPrintStats( pAig );

//printf( "2" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }
   
//Aig_ManDumpBlif( pAig, "inter.blif", NULL, NULL );
//printf( "3" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "4" );
    // refactor
    pAig->Time2Quit = Time;
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Refactor:  " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "5" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }

//printf( "6" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "7" );
    return pAig;
}